

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

Gia_Man_t * Gia_ManFOFUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *__dest;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  uint iData0;
  uint uVar13;
  uint uVar14;
  Gia_Obj_t *pObj_2;
  long lVar15;
  Gia_Obj_t *pObj;
  long lVar16;
  Gia_Obj_t *pObj_1;
  uint uVar17;
  Gia_Obj_t *pObj_3;
  uint local_4c;
  
  iVar3 = p->nObjs;
  iVar5 = p->vCos->nSize;
  iVar6 = p->vCis->nSize;
  p_00 = Gia_ManStart(iVar3 * 9);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar7 = strlen(__s);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar16 = 0;
    do {
      iVar1 = pVVar11->pArray[lVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0058d116;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_0058d0f7;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_0058d0f7;
      pGVar2[iVar1].Value = (int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar11 = p->vCis;
    } while (lVar16 < pVVar11->nSize);
  }
  if (p->nObjs < 1) {
    uVar13 = 0;
  }
  else {
    iVar3 = (iVar3 + ~(iVar5 + iVar6)) * 4;
    lVar15 = 0;
    lVar16 = 8;
    uVar13 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(uint *)((long)pGVar2 + lVar16 + -8);
      if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
        if (((int)uVar13 < 0) || (vMap->nSize <= (int)uVar13)) {
LAB_0058d135:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar14 = uVar13 + 1;
        iVar5 = vMap->pArray[uVar13];
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        uVar10 = uVar10 & 0xe0000000ffffffff | 0x9fffffff;
        if ((iVar5 == 0) || (iVar3 <= (int)uVar14)) {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          if ((pGVar9 < p_00->pObjs) || (iData0 = 0, p_00->pObjs + p_00->nObjs <= pGVar9))
          goto LAB_0058d0f7;
        }
        else {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) {
LAB_0058d0f7:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          iData0 = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)uVar14) goto LAB_0058d135;
        uVar17 = uVar13 + 2;
        iVar5 = vMap->pArray[uVar14];
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        uVar10 = uVar10 & 0xe0000000ffffffff | 0x9fffffff;
        if ((iVar5 == 0) || (iVar3 <= (int)uVar17)) {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          if ((pGVar9 < p_00->pObjs) || (local_4c = 0, p_00->pObjs + p_00->nObjs <= pGVar9))
          goto LAB_0058d0f7;
        }
        else {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          local_4c = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)uVar17) goto LAB_0058d135;
        uVar14 = uVar13 + 3;
        iVar5 = vMap->pArray[uVar17];
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        uVar10 = uVar10 & 0xe0000000ffffffff | 0x9fffffff;
        if ((iVar5 == 0) || (iVar3 <= (int)uVar14)) {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          if ((pGVar9 < p_00->pObjs) || (uVar17 = 0, p_00->pObjs + p_00->nObjs <= pGVar9))
          goto LAB_0058d0f7;
        }
        else {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          uVar17 = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)uVar14) goto LAB_0058d135;
        uVar13 = uVar13 + 4;
        iVar5 = vMap->pArray[uVar14];
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        uVar10 = uVar10 & 0xe0000000ffffffff | 0x9fffffff;
        if ((iVar5 == 0) || (iVar3 <= (int)uVar13)) {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          if ((pGVar9 < p_00->pObjs) || (uVar14 = 0, p_00->pObjs + p_00->nObjs <= pGVar9))
          goto LAB_0058d0f7;
        }
        else {
          *(ulong *)pGVar9 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar10;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0058d0f7;
          uVar14 = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
        }
        uVar10 = *(ulong *)((long)pGVar2 + lVar16 + -8);
        uVar4 = (uint)uVar10;
        if ((uVar4 >> 0x1d & 1) == 0) {
LAB_0058ceef:
          if ((uVar10 & 0x2000000000000000) == 0) {
            if ((uVar4 >> 0x1d & 1) != 0) goto LAB_0058cf2e;
            if ((int)uVar14 < 0) goto LAB_0058d173;
            uVar14 = uVar14 | 1;
          }
          else {
            if ((int)local_4c < 0) goto LAB_0058d173;
            local_4c = local_4c | 1;
          }
        }
        else if ((uVar10 & 0x2000000000000000) == 0) {
          if ((uVar4 >> 0x1d & 1) == 0) goto LAB_0058ceef;
LAB_0058cf2e:
          if ((int)uVar17 < 0) {
LAB_0058d173:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          uVar17 = uVar17 | 1;
        }
        else {
          if ((int)iData0 < 0) goto LAB_0058d173;
          iData0 = iData0 | 1;
        }
        iVar5 = Gia_ManHashMux(p_00,*(int *)((long)pGVar2 +
                                            (ulong)((uVar4 & 0x1fffffff) << 2) * -3 + lVar16),
                               local_4c,iData0);
        iVar6 = Gia_ManHashMux(p_00,*(int *)((long)pGVar2 +
                                            (ulong)((*(uint *)((long)pGVar2 + lVar16 + -8) &
                                                    0x1fffffff) << 2) * -3 + lVar16),uVar14,uVar17);
        iVar5 = Gia_ManHashMux(p_00,*(int *)((long)pGVar2 +
                                            (ulong)((*(uint *)((long)pGVar2 + lVar16 + -4) &
                                                    0x1fffffff) << 2) * -3 + lVar16),iVar6,iVar5);
        *(int *)(&pGVar2->field_0x0 + lVar16) = iVar5;
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  if (uVar13 != vMap->nSize) {
    __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x243,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar16 = 0;
    do {
      iVar3 = pVVar11->pArray[lVar16];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_0058d116:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar3;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar13 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                    pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value
                              );
      pGVar2->Value = uVar13;
      lVar16 = lVar16 + 1;
      pVVar11 = p->vCos;
    } while (lVar16 < pVVar11->nSize);
  }
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar3 = p->vCis->nSize;
  if (pGVar12->vCis->nSize - pGVar12->nRegs != iVar3 + (~(p->vCos->nSize + iVar3) + p->nObjs) * 4) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x248,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManFOFUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl0, iCtrl1, iCtrl2, iCtrl3, iMuxA, iMuxB, iFuncVars = 0;
    int VarLimit = 4 * Gia_ManAndNum(p);
    pNew = Gia_ManStart( 9 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl0 = Gia_ManAppendCi(pNew);
        else
            iCtrl0 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl1 = Gia_ManAppendCi(pNew);
        else
            iCtrl1 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl2 = Gia_ManAppendCi(pNew);
        else
            iCtrl2 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl3 = Gia_ManAppendCi(pNew);
        else
            iCtrl3 = 0, Gia_ManAppendCi(pNew);

        if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl0 = Abc_LitNot(iCtrl0);
        else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl1 = Abc_LitNot(iCtrl1);
        else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl2 = Abc_LitNot(iCtrl2);
        else //if ( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl3 = Abc_LitNot(iCtrl3);

        iMuxA       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl1, iCtrl0 );
        iMuxB       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl3, iCtrl2 );
        pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin1(pObj)->Value, iMuxB,  iMuxA );
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p) );
    return pNew;
}